

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_grp.c
# Opt level: O0

void * GRP_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  int iVar1;
  void *unpkarc;
  PHYSFS_uint32 count;
  PHYSFS_uint8 buf [12];
  int *claimed_local;
  int forWriting_local;
  char *name_local;
  PHYSFS_Io *io_local;
  
  unpkarc._0_4_ = 0;
  buf._4_8_ = claimed;
  if (io == (PHYSFS_Io *)0x0) {
    __assert_fail("io != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/REGoth-project[P]physfs/src/physfs_archiver_grp.c"
                  ,0x42,"void *GRP_openArchive(PHYSFS_Io *, const char *, int, int *)");
  }
  if (forWriting == 0) {
    iVar1 = __PHYSFS_readAll(io,(void *)((long)&unpkarc + 4),0xc);
    if (iVar1 == 0) {
      io_local = (PHYSFS_Io *)0x0;
    }
    else {
      iVar1 = memcmp((void *)((long)&unpkarc + 4),"KenSilverman",0xc);
      if (iVar1 == 0) {
        *(undefined4 *)buf._4_8_ = 1;
        iVar1 = __PHYSFS_readAll(io,&unpkarc,4);
        if (iVar1 == 0) {
          io_local = (PHYSFS_Io *)0x0;
        }
        else {
          unpkarc._0_4_ = PHYSFS_swapULE32((PHYSFS_uint32)unpkarc);
          io_local = (PHYSFS_Io *)UNPK_openArchive(io);
          if (io_local == (PHYSFS_Io *)0x0) {
            io_local = (PHYSFS_Io *)0x0;
          }
          else {
            iVar1 = grpLoadEntries(io,(PHYSFS_uint32)unpkarc,io_local);
            if (iVar1 == 0) {
              UNPK_abandonArchive(io_local);
              io_local = (PHYSFS_Io *)0x0;
            }
          }
        }
      }
      else {
        PHYSFS_setErrorCode(PHYSFS_ERR_UNSUPPORTED);
        io_local = (PHYSFS_Io *)0x0;
      }
    }
  }
  else {
    PHYSFS_setErrorCode(PHYSFS_ERR_READ_ONLY);
    io_local = (PHYSFS_Io *)0x0;
  }
  return io_local;
}

Assistant:

static void *GRP_openArchive(PHYSFS_Io *io, const char *name,
                             int forWriting, int *claimed)
{
    PHYSFS_uint8 buf[12];
    PHYSFS_uint32 count = 0;
    void *unpkarc = NULL;

    assert(io != NULL);  /* shouldn't ever happen. */

    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, buf, sizeof (buf)), NULL);
    if (memcmp(buf, "KenSilverman", sizeof (buf)) != 0)
        BAIL(PHYSFS_ERR_UNSUPPORTED, NULL);

    *claimed = 1;

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &count, sizeof(count)), NULL);
    count = PHYSFS_swapULE32(count);

    unpkarc = UNPK_openArchive(io);
    BAIL_IF_ERRPASS(!unpkarc, NULL);

    if (!grpLoadEntries(io, count, unpkarc))
    {
        UNPK_abandonArchive(unpkarc);
        return NULL;
    } /* if */

    return unpkarc;
}